

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io_context.hpp
# Opt level: O0

void __thiscall
asio::io_context::basic_executor_type<std::allocator<void>,_0UL>::
execute<asio::detail::executor_function>
          (basic_executor_type<std::allocator<void>,_0UL> *this,executor_function *f)

{
  bool bVar1;
  uintptr_t uVar2;
  executor_op<asio::detail::executor_function,_std::allocator<void>,_asio::detail::scheduler_operation>
  *h;
  executor_function *in_RSI;
  executor_op<asio::detail::executor_function,_std::allocator<void>,_asio::detail::scheduler_operation>
  *in_RDI;
  ptr p;
  fenced_block b;
  function_type tmp;
  executor_function *in_stack_ffffffffffffff98;
  allocator<void> *in_stack_ffffffffffffffa0;
  std_fenced_block *in_stack_ffffffffffffffa8;
  undefined1 in_stack_ffffffffffffffd7;
  operation *in_stack_ffffffffffffffd8;
  scheduler *in_stack_ffffffffffffffe0;
  executor_function local_18;
  executor_function *local_10;
  
  local_10 = in_RSI;
  uVar2 = bits((basic_executor_type<std::allocator<void>,_0UL> *)in_RDI);
  if ((uVar2 & 1) == 0) {
    context_ptr((basic_executor_type<std::allocator<void>,_0UL> *)in_RDI);
    bVar1 = detail::scheduler::can_dispatch((scheduler *)0x1c1a6e);
    if (bVar1) {
      detail::executor_function::executor_function(&local_18,local_10);
      detail::std_fenced_block::std_fenced_block
                (in_stack_ffffffffffffffa8,(full_t)((ulong)in_stack_ffffffffffffffa0 >> 0x20));
      asio_handler_invoke_helpers::
      invoke<asio::detail::executor_function,asio::detail::executor_function>
                ((executor_function *)in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
      detail::std_fenced_block::~std_fenced_block(in_stack_ffffffffffffffa8);
      detail::executor_function::~executor_function((executor_function *)in_stack_ffffffffffffffa0);
      return;
    }
  }
  h = detail::
      executor_op<asio::detail::executor_function,_std::allocator<void>,_asio::detail::scheduler_operation>
      ::ptr::allocate(in_stack_ffffffffffffffa0);
  detail::
  executor_op<asio::detail::executor_function,_std::allocator<void>,_asio::detail::scheduler_operation>
  ::executor_op<asio::detail::executor_function>
            (in_RDI,(executor_function *)h,in_stack_ffffffffffffffa0);
  context_ptr((basic_executor_type<std::allocator<void>,_0UL> *)in_RDI);
  bits((basic_executor_type<std::allocator<void>,_0UL> *)in_RDI);
  detail::scheduler::post_immediate_completion
            (in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8,(bool)in_stack_ffffffffffffffd7);
  detail::
  executor_op<asio::detail::executor_function,_std::allocator<void>,_asio::detail::scheduler_operation>
  ::ptr::~ptr((ptr *)0x1c1bfb);
  return;
}

Assistant:

void io_context::basic_executor_type<Allocator, Bits>::execute(
    ASIO_MOVE_ARG(Function) f) const
{
  typedef typename decay<Function>::type function_type;

  // Invoke immediately if the blocking.possibly property is enabled and we are
  // already inside the thread pool.
  if ((bits() & blocking_never) == 0 && context_ptr()->impl_.can_dispatch())
  {
    // Make a local, non-const copy of the function.
    function_type tmp(ASIO_MOVE_CAST(Function)(f));

#if defined(ASIO_HAS_STD_EXCEPTION_PTR) \
  && !defined(ASIO_NO_EXCEPTIONS)
    try
    {
#endif // defined(ASIO_HAS_STD_EXCEPTION_PTR)
       //   && !defined(ASIO_NO_EXCEPTIONS)
      detail::fenced_block b(detail::fenced_block::full);
      asio_handler_invoke_helpers::invoke(tmp, tmp);
      return;
#if defined(ASIO_HAS_STD_EXCEPTION_PTR) \
  && !defined(ASIO_NO_EXCEPTIONS)
    }
    catch (...)
    {
      context_ptr()->impl_.capture_current_exception();
      return;
    }
#endif // defined(ASIO_HAS_STD_EXCEPTION_PTR)
       //   && !defined(ASIO_NO_EXCEPTIONS)
  }

  // Allocate and construct an operation to wrap the function.
  typedef detail::executor_op<function_type, Allocator, detail::operation> op;
  typename op::ptr p = {
      detail::addressof(static_cast<const Allocator&>(*this)),
      op::ptr::allocate(static_cast<const Allocator&>(*this)), 0 };
  p.p = new (p.v) op(ASIO_MOVE_CAST(Function)(f),
      static_cast<const Allocator&>(*this));

  ASIO_HANDLER_CREATION((*context_ptr(), *p.p,
        "io_context", context_ptr(), 0, "execute"));

  context_ptr()->impl_.post_immediate_completion(p.p,
      (bits() & relationship_continuation) != 0);
  p.v = p.p = 0;
}